

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::Preface::Preface(Preface *this,Preface *rhs)

{
  Preface *rhs_local;
  Preface *this_local;
  
  InterchangeObject::InterchangeObject
            (&this->super_InterchangeObject,(rhs->super_InterchangeObject).m_Dict);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__Preface_00338e58;
  Kumu::Timestamp::Timestamp(&this->LastModifiedDate);
  optional_property<unsigned_int>::optional_property(&this->ObjectModelVersion);
  optional_property<Kumu::UUID>::optional_property(&this->PrimaryPackage);
  Array<Kumu::UUID>::Array(&this->Identifications);
  Kumu::UUID::UUID(&this->ContentStorage);
  UL::UL(&this->OperationalPattern);
  Batch<ASDCP::UL>::Batch(&this->EssenceContainers);
  Batch<ASDCP::UL>::Batch(&this->DMSchemes);
  optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::optional_property(&this->ApplicationSchemes);
  optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::optional_property
            (&this->ConformsToSpecifications);
  if ((this->super_InterchangeObject).m_Dict != (Dictionary *)0x0) {
    UL::operator=(&(this->super_InterchangeObject).super_KLVPacket.m_UL,
                  &(rhs->super_InterchangeObject).super_KLVPacket.m_UL);
    (*(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket[0x12])(this,rhs);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                0x271,"ASDCP::MXF::Preface::Preface(const Preface &)");
}

Assistant:

ASDCP::MXF::Preface::Preface(const Preface& rhs) : InterchangeObject(rhs.m_Dict)
{
  assert(m_Dict);
  m_UL = rhs.m_UL;
  Copy(rhs);
}